

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Version::Clear(Version *this)

{
  anon_union_32_1_493b367e_for_Version_4 aVar1;
  undefined8 *puVar2;
  
  aVar1 = this->field_0;
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.suffix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
  }
  if (((undefined1  [32])aVar1 & (undefined1  [32])0xe) != (undefined1  [32])0x0) {
    (this->field_0)._impl_.patch_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x10) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Version::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.Version)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    _impl_.suffix_.ClearNonDefaultToEmpty();
  }
  if (cached_has_bits & 0x0000000eu) {
    ::memset(&_impl_.major_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.patch_) -
        reinterpret_cast<char*>(&_impl_.major_)) + sizeof(_impl_.patch_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}